

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

Status __thiscall spvtools::opt::SSARewriter::RewriteFunctionIntoSSA(SSARewriter *this,Function *fp)

{
  bool bVar1;
  CFG *this_00;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> *this_01;
  pointer bb;
  anon_class_8_1_8991fb9c aStack_50;
  bool modified;
  function<bool_(spvtools::opt::BasicBlock_*)> local_48;
  undefined1 local_21;
  Function *pFStack_20;
  bool succeeded;
  Function *fp_local;
  SSARewriter *this_local;
  
  pFStack_20 = fp;
  fp_local = (Function *)this;
  MemPass::CollectTargetVars(this->pass_,fp);
  this_00 = Pass::cfg(&this->pass_->super_Pass);
  this_01 = opt::Function::entry(pFStack_20);
  bb = std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
       get(this_01);
  aStack_50.this = this;
  std::function<bool(spvtools::opt::BasicBlock*)>::
  function<spvtools::opt::SSARewriter::RewriteFunctionIntoSSA(spvtools::opt::Function*)::__0,void>
            ((function<bool(spvtools::opt::BasicBlock*)> *)&local_48,&stack0xffffffffffffffb0);
  bVar1 = CFG::WhileEachBlockInReversePostOrder(this_00,bb,&local_48);
  std::function<bool_(spvtools::opt::BasicBlock_*)>::~function(&local_48);
  if (bVar1) {
    local_21 = bVar1;
    FinalizePhiCandidates(this);
    bVar1 = ApplyReplacements(this);
    this_local._4_4_ = SuccessWithoutChange;
    if (bVar1) {
      this_local._4_4_ = SuccessWithChange;
    }
  }
  else {
    this_local._4_4_ = Failure;
  }
  return this_local._4_4_;
}

Assistant:

Pass::Status SSARewriter::RewriteFunctionIntoSSA(Function* fp) {
#if SSA_REWRITE_DEBUGGING_LEVEL > 0
  std::cerr << "Function before SSA rewrite:\n"
            << fp->PrettyPrint(0) << "\n\n\n";
#endif

  // Collect variables that can be converted into SSA IDs.
  pass_->CollectTargetVars(fp);

  // Generate all the SSA replacements and Phi candidates. This will
  // generate incomplete and trivial Phis.
  bool succeeded = pass_->cfg()->WhileEachBlockInReversePostOrder(
      fp->entry().get(), [this](BasicBlock* bb) {
        if (!GenerateSSAReplacements(bb)) {
          return false;
        }
        return true;
      });

  if (!succeeded) {
    return Pass::Status::Failure;
  }

  // Remove trivial Phis and add arguments to incomplete Phis.
  FinalizePhiCandidates();

  // Finally, apply all the replacements in the IR.
  bool modified = ApplyReplacements();

#if SSA_REWRITE_DEBUGGING_LEVEL > 0
  std::cerr << "\n\n\nFunction after SSA rewrite:\n"
            << fp->PrettyPrint(0) << "\n";
#endif

  return modified ? Pass::Status::SuccessWithChange
                  : Pass::Status::SuccessWithoutChange;
}